

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

int __thiscall mp::SOLHandler_Easy::NItemsMax(SOLHandler_Easy *this,int kind)

{
  switch(kind & 3) {
  case 0:
    return (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars;
  case 1:
    return (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons +
           (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
  case 2:
    return (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs;
  case 3:
    return 1;
  }
}

Assistant:

int NItemsMax(int kind) const {
    switch (kind & 3) {    // Without the Float bit
    case 0: return header_.num_vars;
    case 1: return
          header_.num_algebraic_cons
          + header_.num_logical_cons;
    case 2: return header_.num_objs;
    default: return 1;
    }
  }